

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_124b022::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test
::TestBody(HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test *this)

{
  uint uVar1;
  _func_int ***ppp_Var2;
  char cVar3;
  bool bVar4;
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> this_00;
  Message *pMVar5;
  SEARCH_METHODS *pSVar6;
  AssertHelper local_60;
  double psnr;
  AssertHelper local_50;
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> local_48;
  AssertionResult gtest_ar;
  
  local_48._M_head_impl = (VideoSource *)0x0;
  this_00._M_head_impl = (VideoSource *)operator_new(0xd8);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             (this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.filename,
             (allocator *)&psnr);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)this_00._M_head_impl,(string *)&gtest_ar,0,
             (this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.limit);
  if (local_48._M_head_impl != (VideoSource *)0x0) {
    ppp_Var2 = &(local_48._M_head_impl)->_vptr_VideoSource;
    local_48._M_head_impl = this_00._M_head_impl;
    (*(*ppp_Var2)[1])();
    this_00._M_head_impl = local_48._M_head_impl;
  }
  local_48._M_head_impl = this_00._M_head_impl;
  std::__cxx11::string::~string((string *)&gtest_ar);
  psnr = 0.0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            ((internal *)&gtest_ar,"video","nullptr",
             (unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )&local_48,(void **)&psnr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&psnr);
    if ((undefined8 *)
        CONCAT71(gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._1_7_,
                 (char)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl) == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)
                CONCAT71(gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         (char)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
               ,0x178,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&psnr);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (psnr != 0.0) {
      (**(code **)(*(long *)psnr + 8))();
    }
LAB_005dc7dd:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)&gtest_ar);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        (*(this->super_HorzSuperresQThreshEndToEndTest).super_EncoderTest._vptr_EncoderTest[2])
                  (&(this->super_HorzSuperresQThreshEndToEndTest).super_EncoderTest,
                   local_48._M_head_impl);
      }
      cVar3 = (char)gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)&gtest_ar);
      if (cVar3 == '\0') {
        uVar1 = (this->super_HorzSuperresQThreshEndToEndTest).frame_count_;
        psnr = 0.0;
        if (uVar1 != 0) {
          psnr = (this->super_HorzSuperresQThreshEndToEndTest).psnr_ / (double)uVar1;
        }
        testing::internal::CmpHelperGT<double,double>
                  ((internal *)&gtest_ar,"psnr","test_video_param_.psnr_threshold",&psnr,
                   &(this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.psnr_threshold);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_60);
          std::operator<<((ostream *)&(local_60.data_)->line,"superres_mode_ = ");
          pMVar5 = testing::Message::operator<<
                             ((Message *)&local_60,
                              (anon_enum_32 *)
                              &(this->super_HorzSuperresQThreshEndToEndTest).superres_mode_);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [23])", superres_qthresh_ = ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,&(this->super_HorzSuperresQThreshEndToEndTest).
                                      superres_qthresh_);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [26])", superres_kf_qthresh_ = ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,&(this->super_HorzSuperresQThreshEndToEndTest).
                                      superres_kf_qthresh_);
          if ((undefined8 *)
              CONCAT71(gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       (char)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._1_7_,
                               (char)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
                     ,0x17c,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_50,pMVar5);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_60.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)&gtest_ar,"test_video_param_.limit","frame_count_",
                   &(this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.limit,
                   &(this->super_HorzSuperresQThreshEndToEndTest).frame_count_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_60);
          std::operator<<((ostream *)&(local_60.data_)->line,"superres_mode_ = ");
          pMVar5 = testing::Message::operator<<
                             ((Message *)&local_60,
                              (anon_enum_32 *)
                              &(this->super_HorzSuperresQThreshEndToEndTest).superres_mode_);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [23])", superres_qthresh_ = ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,&(this->super_HorzSuperresQThreshEndToEndTest).
                                      superres_qthresh_);
          pMVar5 = testing::Message::operator<<(pMVar5,(char (*) [26])", superres_kf_qthresh_ = ");
          pMVar5 = testing::Message::operator<<
                             (pMVar5,&(this->super_HorzSuperresQThreshEndToEndTest).
                                      superres_kf_qthresh_);
          if ((undefined8 *)
              CONCAT71(gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       (char)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._1_7_,
                               (char)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
                     ,0x181,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_50,pMVar5);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (local_60.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
        goto LAB_005dc7dd;
      }
    }
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&psnr,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
               ,0x17a,
               "Expected: RunLoop(video.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&psnr,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&psnr);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  if ((Y4mVideoSource *)local_48._M_head_impl != (Y4mVideoSource *)0x0) {
    (*((VideoSource *)&(local_48._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
  }
  return;
}

Assistant:

TEST_P(HorzSuperresQThreshEndToEndTest, HorzSuperresQThreshEndToEndPSNRTest) {
  DoTest();
}